

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

GradientStop * __thiscall
lunasvg::SVGStopElement::gradientStop
          (GradientStop *__return_storage_ptr__,SVGStopElement *this,float opacity)

{
  float fVar1;
  Color local_18;
  float local_14;
  Color stopColor;
  float opacity_local;
  SVGStopElement *this_local;
  
  local_14 = opacity;
  _stopColor = this;
  local_18 = Color::colorWithAlpha(&this->m_stop_color,this->m_stop_opacity * opacity);
  fVar1 = SVGNumberPercentage::value(&this->m_offset);
  __return_storage_ptr__->offset = fVar1;
  fVar1 = Color::redF(&local_18);
  (__return_storage_ptr__->color).r = fVar1;
  fVar1 = Color::greenF(&local_18);
  (__return_storage_ptr__->color).g = fVar1;
  fVar1 = Color::blueF(&local_18);
  (__return_storage_ptr__->color).b = fVar1;
  fVar1 = Color::alphaF(&local_18);
  (__return_storage_ptr__->color).a = fVar1;
  return __return_storage_ptr__;
}

Assistant:

GradientStop SVGStopElement::gradientStop(float opacity) const
{
    Color stopColor = m_stop_color.colorWithAlpha(m_stop_opacity * opacity);
    GradientStop gradientStop = {
        m_offset.value(), { stopColor.redF(), stopColor.greenF(), stopColor.blueF(), stopColor.alphaF() }
    };

    return gradientStop;
}